

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

GLFWbool openJoystickDevice(char *path)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  _GLFWjoystick *js_00;
  _GLFWjoystick *js;
  _GLFWjoystickLinux linjs;
  input_id id;
  int hatCount;
  int buttonCount;
  int axisCount;
  char absBits [8];
  char keyBits [96];
  byte local_17c [4];
  char local_178 [4];
  char evBits [4];
  char guid [33];
  char local_148;
  char local_147;
  char local_146;
  char local_145;
  char local_144;
  char local_143;
  char local_142;
  char local_141;
  char name [256];
  int code;
  int jid;
  char *path_local;
  
  memset(&local_148,0,0x100);
  memset(local_178,0,0x21);
  memset(local_17c,0,4);
  memset(absBits,0,0x60);
  memset(&buttonCount,0,8);
  hatCount = 0;
  id.product = 0;
  id.version = 0;
  id.bustype = 0;
  id.vendor = 0;
  memset(&js,0,0x1f24);
  name[0xfc] = '\0';
  name[0xfd] = '\0';
  name[0xfe] = '\0';
  name[0xff] = '\0';
  while( true ) {
    if (0xf < (int)name._252_4_) {
      js._0_4_ = open(path,0x800);
      if ((int)js == -1) {
        path_local._4_4_ = 0;
      }
      else {
        iVar1 = ioctl((int)js,0x80044520,local_17c);
        if ((((iVar1 < 0) || (iVar1 = ioctl((int)js,0x80604521,absBits), iVar1 < 0)) ||
            (iVar1 = ioctl((int)js,0x80084523,&buttonCount), iVar1 < 0)) ||
           (iVar1 = ioctl((int)js,0x80084502,linjs.hats + 3), iVar1 < 0)) {
          piVar2 = __errno_location();
          pcVar3 = strerror(*piVar2);
          _glfwInputError(0x10008,"Linux: Failed to query input device: %s",pcVar3);
          close((int)js);
          path_local._4_4_ = 0;
        }
        else if (((local_17c[0] & 2) == 0) || ((local_17c[0] & 8) == 0)) {
          close((int)js);
          path_local._4_4_ = 0;
        }
        else {
          iVar1 = ioctl((int)js,0x81004506,&local_148);
          if (iVar1 < 0) {
            strncpy(&local_148,"Unknown",0x100);
          }
          if (((linjs.hats[3][0]._2_2_ == 0) || ((ushort)linjs.hats[3][1] == 0)) ||
             (linjs.hats[3][1]._2_2_ == 0)) {
            sprintf(local_178,"%02x%02x0000%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x00",
                    (ulong)((ushort)linjs.hats[3][0] & 0xff),
                    (ulong)(uint)((int)(uint)(ushort)linjs.hats[3][0] >> 8),
                    (ulong)(uint)(int)local_148,(ulong)(uint)(int)local_147,(int)local_146,
                    (int)local_145,(int)local_144,(int)local_143,(int)local_142,(int)local_141,
                    (int)name[0],(int)name[1],(int)name[2]);
          }
          else {
            sprintf(local_178,"%02x%02x0000%02x%02x0000%02x%02x0000%02x%02x0000",
                    (ulong)((ushort)linjs.hats[3][0] & 0xff),
                    (ulong)(uint)((int)(uint)(ushort)linjs.hats[3][0] >> 8),
                    (ulong)(linjs.hats[3][0]._2_2_ & 0xff),
                    (ulong)(uint)((int)(uint)linjs.hats[3][0]._2_2_ >> 8),
                    (ushort)linjs.hats[3][1] & 0xff,(int)(uint)(ushort)linjs.hats[3][1] >> 8,
                    linjs.hats[3][1]._2_2_ & 0xff,(int)(uint)linjs.hats[3][1]._2_2_ >> 8);
          }
          name[0xf8] = '\0';
          name[0xf9] = '\x01';
          name[0xfa] = '\0';
          name[0xfb] = '\0';
          for (; (int)name._248_4_ < 0x300; name._248_4_ = name._248_4_ + 1) {
            if (((int)absBits[(int)name._248_4_ / 8] &
                1 << ((byte)((long)(int)name._248_4_ % 8) & 0x1f)) != 0) {
              linjs.keyMap[(long)(name._248_4_ + -0x100) + -2] = id._4_4_;
              id._4_4_ = id._4_4_ + 1;
            }
          }
          name[0xf8] = '\0';
          name[0xf9] = '\0';
          name[0xfa] = '\0';
          name[0xfb] = '\0';
          for (; (int)name._248_4_ < 0x40; name._248_4_ = name._248_4_ + 1) {
            linjs.absMap[(long)(int)name._248_4_ + -2] = -1;
            if (((int)*(char *)((long)&buttonCount + (long)((int)name._248_4_ / 8)) &
                1 << ((byte)((long)(int)name._248_4_ % 8) & 0x1f)) != 0) {
              if (((int)name._248_4_ < 0x10) || (0x17 < (int)name._248_4_)) {
                iVar1 = ioctl((int)js,(ulong)(name._248_4_ + 0x40 | 0x80004500) | 0x180000,
                              &linjs.absInfo[(long)(int)name._248_4_ + -1].flat);
                if (-1 < iVar1) {
                  linjs.absMap[(long)(int)name._248_4_ + -2] = hatCount;
                  hatCount = hatCount + 1;
                }
              }
              else {
                linjs.absMap[(long)(int)name._248_4_ + -2] = id._0_4_;
                id._0_4_ = id._0_4_ + 1;
                name._248_4_ = name._248_4_ + 1;
              }
            }
          }
          js_00 = _glfwAllocJoystick(&local_148,local_178,hatCount,id._4_4_,id._0_4_);
          if (js_00 == (_GLFWjoystick *)0x0) {
            close((int)js);
            path_local._4_4_ = 0;
          }
          else {
            strncpy((char *)((long)&js + 4),path,0x1000);
            memcpy(&js_00->linjs,&js,0x1f24);
            pollAbsState(js_00);
            _glfwInputJoystick(js_00,0x40001);
            path_local._4_4_ = 1;
          }
        }
      }
      return path_local._4_4_;
    }
    if ((_glfw.joysticks[(int)name._252_4_].present != 0) &&
       (iVar1 = strcmp(_glfw.joysticks[(int)name._252_4_].linjs.path,path), iVar1 == 0)) break;
    name._252_4_ = name._252_4_ + 1;
  }
  return 0;
}

Assistant:

static GLFWbool openJoystickDevice(const char* path)
{
    int jid, code;
    char name[256] = "";
    char guid[33] = "";
    char evBits[(EV_CNT + 7) / 8] = {0};
    char keyBits[(KEY_CNT + 7) / 8] = {0};
    char absBits[(ABS_CNT + 7) / 8] = {0};
    int axisCount = 0, buttonCount = 0, hatCount = 0;
    struct input_id id;
    _GLFWjoystickLinux linjs = {0};
    _GLFWjoystick* js = NULL;

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        if (!_glfw.joysticks[jid].present)
            continue;
        if (strcmp(_glfw.joysticks[jid].linjs.path, path) == 0)
            return GLFW_FALSE;
    }

    linjs.fd = open(path, O_RDONLY | O_NONBLOCK);
    if (linjs.fd == -1)
        return GLFW_FALSE;

    if (ioctl(linjs.fd, EVIOCGBIT(0, sizeof(evBits)), evBits) < 0 ||
        ioctl(linjs.fd, EVIOCGBIT(EV_KEY, sizeof(keyBits)), keyBits) < 0 ||
        ioctl(linjs.fd, EVIOCGBIT(EV_ABS, sizeof(absBits)), absBits) < 0 ||
        ioctl(linjs.fd, EVIOCGID, &id) < 0)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Linux: Failed to query input device: %s",
                        strerror(errno));
        close(linjs.fd);
        return GLFW_FALSE;
    }

    // Ensure this device supports the events expected of a joystick
    if (!isBitSet(EV_KEY, evBits) || !isBitSet(EV_ABS, evBits))
    {
        close(linjs.fd);
        return GLFW_FALSE;
    }

    if (ioctl(linjs.fd, EVIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    // Generate a joystick GUID that matches the SDL 2.0.5+ one
    if (id.vendor && id.product && id.version)
    {
        sprintf(guid, "%02x%02x0000%02x%02x0000%02x%02x0000%02x%02x0000",
                id.bustype & 0xff, id.bustype >> 8,
                id.vendor & 0xff,  id.vendor >> 8,
                id.product & 0xff, id.product >> 8,
                id.version & 0xff, id.version >> 8);
    }
    else
    {
        sprintf(guid, "%02x%02x0000%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x00",
                id.bustype & 0xff, id.bustype >> 8,
                name[0], name[1], name[2], name[3],
                name[4], name[5], name[6], name[7],
                name[8], name[9], name[10]);
    }

    for (code = BTN_MISC;  code < KEY_CNT;  code++)
    {
        if (!isBitSet(code, keyBits))
            continue;

        linjs.keyMap[code - BTN_MISC] = buttonCount;
        buttonCount++;
    }

    for (code = 0;  code < ABS_CNT;  code++)
    {
        linjs.absMap[code] = -1;
        if (!isBitSet(code, absBits))
            continue;

        if (code >= ABS_HAT0X && code <= ABS_HAT3Y)
        {
            linjs.absMap[code] = hatCount;
            hatCount++;
            // Skip the Y axis
            code++;
        }
        else
        {
            if (ioctl(linjs.fd, EVIOCGABS(code), &linjs.absInfo[code]) < 0)
                continue;

            linjs.absMap[code] = axisCount;
            axisCount++;
        }
    }

    js = _glfwAllocJoystick(name, guid, axisCount, buttonCount, hatCount);
    if (!js)
    {
        close(linjs.fd);
        return GLFW_FALSE;
    }

    strncpy(linjs.path, path, sizeof(linjs.path));
    memcpy(&js->linjs, &linjs, sizeof(linjs));

    pollAbsState(js);

    _glfwInputJoystick(js, GLFW_CONNECTED);
    return GLFW_TRUE;
}